

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void dequantize_row_q4_1(void *x,float *y,int k)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  undefined4 in_R11D;
  undefined3 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar4 = (int)((long)k / 0x20);
  pbVar6 = (byte *)((long)x + (long)iVar4 * 8);
  uVar7 = 0;
  uVar5 = (long)k / 0x20 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    uVar1 = *(undefined4 *)((long)x + uVar7 * 4 + (long)iVar4 * 4);
    auVar11._4_4_ = uVar1;
    auVar11._0_4_ = uVar1;
    auVar11._8_4_ = uVar1;
    auVar11._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)x + uVar7 * 4);
    auVar12._4_4_ = uVar1;
    auVar12._0_4_ = uVar1;
    auVar12._8_4_ = uVar1;
    auVar12._12_4_ = uVar1;
    pbVar8 = pbVar6;
    for (uVar9 = 0; uVar9 < 0x20; uVar9 = uVar9 + 2) {
      uVar10 = (undefined3)((uint)in_R11D >> 8);
      in_R11D = CONCAT31(uVar10,*pbVar8 >> 4);
      auVar3 = vpinsrb_avx(ZEXT416(CONCAT31(uVar10,*pbVar8) & 0xffffff0f),in_R11D,1);
      auVar3 = vpmovzxbd_avx(auVar3);
      auVar3 = vcvtdq2ps_avx(auVar3);
      auVar3 = vfmadd213ps_fma(auVar3,auVar11,auVar12);
      uVar2 = vmovlps_avx(auVar3);
      *(undefined8 *)(y + uVar9) = uVar2;
      pbVar8 = pbVar8 + 1;
    }
    y = y + 0x20;
    pbVar6 = pbVar6 + 0x10;
  }
  return;
}

Assistant:

void dequantize_row_q4_1(const void * restrict x, float * restrict y, int k) {
    assert(k % QK == 0);

    const int nb = k / QK;

    const float   * restrict pm = (const float *)   (x);
    const float   * restrict pd = (const float *)   (pm + nb);
    const uint8_t * restrict pb = (const uint8_t *) (pd + nb);

    for (int i = 0; i < nb; i++) {
        const float m = pm[i];
        const float d = pd[i];

        const uint8_t * restrict pp = pb + i*QK/2;

        for (int l = 0; l < QK; l += 2) {
            const uint8_t vi = pp[l/2];

            const int8_t vi0 = vi & 0xf;
            const int8_t vi1 = vi >> 4;

            const float v0 = vi0*d + m;
            const float v1 = vi1*d + m;

            y[i*QK + l + 0] = v0;
            y[i*QK + l + 1] = v1;

            assert(!isnan(y[i*QK + l + 0]));
            assert(!isnan(y[i*QK + l + 1]));
        }
    }
}